

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall
Memory::RecyclerParallelThread::EnableConcurrent(RecyclerParallelThread *this,bool waitForThread)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  undefined4 *puVar4;
  HANDLE pVVar5;
  HANDLE pVStack_38;
  DWORD ret;
  HANDLE handle [2];
  ThreadHandle threadHandle;
  bool waitForThread_local;
  RecyclerParallelThread *this_local;
  
  this->synchronizeOnStartup = waitForThread;
  if (this->concurrentWorkDoneEvent != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1ada,"(this->concurrentWorkDoneEvent == 0)",
                       "this->concurrentWorkDoneEvent == NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1adb,"(this->concurrentWorkReadyEvent == 0)",
                       "this->concurrentWorkReadyEvent == NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->concurrentThread != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1adc,"(this->concurrentThread == 0)","this->concurrentThread == NULL");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pVVar5 = CreateEventW((LPSECURITY_ATTRIBUTES)0x0,0,0,(LPCWSTR)0x0);
  this->concurrentWorkDoneEvent = pVVar5;
  if (this->concurrentWorkDoneEvent == (HANDLE)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pVVar5 = CreateEventW((LPSECURITY_ATTRIBUTES)0x0,0,0,(LPCWSTR)0x0);
    this->concurrentWorkReadyEvent = pVVar5;
    if (this->concurrentWorkReadyEvent == (HANDLE)0x0) {
      CloseHandle(this->concurrentWorkDoneEvent);
      this->concurrentWorkDoneEvent = (HANDLE)0x0;
      this_local._7_1_ = false;
    }
    else {
      handle[1] = (HANDLE)PlatformAgnostic::Thread::Create
                                    (300000,StaticThreadProc,this,
                                     ThreadInitStackSizeParamIsAReservation,
                                     L"Chakra Recycler Parallel Thread");
      if ((undefined1 *)handle[1] != &DAT_ffffffffffffffff) {
        this->concurrentThread = handle[1];
      }
      if ((this->concurrentThread != (HANDLE)0x0) && (waitForThread)) {
        pVStack_38 = this->concurrentWorkDoneEvent;
        handle[0] = this->concurrentThread;
        DVar3 = WaitForMultipleObjectsEx(2,&stack0xffffffffffffffc8,0,0xffffffff,0);
        if (DVar3 == 0) {
          return true;
        }
        CloseHandle(this->concurrentThread);
        this->concurrentThread = (HANDLE)0x0;
      }
      if (this->concurrentThread == (HANDLE)0x0) {
        CloseHandle(this->concurrentWorkDoneEvent);
        this->concurrentWorkDoneEvent = (HANDLE)0x0;
        CloseHandle(this->concurrentWorkReadyEvent);
        this->concurrentWorkReadyEvent = (HANDLE)0x0;
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
RecyclerParallelThread::EnableConcurrent(bool waitForThread)
{
    this->synchronizeOnStartup = waitForThread;

    Assert(this->concurrentWorkDoneEvent == NULL);
    Assert(this->concurrentWorkReadyEvent == NULL);
    Assert(this->concurrentThread == NULL);

    this->concurrentWorkDoneEvent = CreateEvent(NULL, FALSE, FALSE, NULL);
    if (this->concurrentWorkDoneEvent == nullptr)
    {
        return false;
    }

    this->concurrentWorkReadyEvent = CreateEvent(NULL, FALSE, FALSE, NULL);
    if (this->concurrentWorkReadyEvent == nullptr)
    {
        CloseHandle(this->concurrentWorkDoneEvent);
        this->concurrentWorkDoneEvent = NULL;
        return false;
    }

    auto threadHandle = PlatformAgnostic::Thread::Create(Recycler::ConcurrentThreadStackSize, 
      &RecyclerParallelThread::StaticThreadProc, this,
      PlatformAgnostic::Thread::ThreadInitStackSizeParamIsAReservation, _u("Chakra Recycler Parallel Thread"));

    if (threadHandle != PlatformAgnostic::Thread::InvalidHandle)
    {
        this->concurrentThread = reinterpret_cast<HANDLE>(threadHandle);
    }

    if (this->concurrentThread != nullptr && waitForThread)
    {
        // Wait for thread to initialize
        HANDLE handle[2] = { this->concurrentWorkDoneEvent, this->concurrentThread };
        DWORD ret = WaitForMultipleObjectsEx(2, handle, FALSE, INFINITE, FALSE);
        if (ret == WAIT_OBJECT_0)
        {
            return true;
        }

        CloseHandle(concurrentThread);
        concurrentThread = nullptr;
    }

    if (this->concurrentThread == nullptr)
    {
        CloseHandle(this->concurrentWorkDoneEvent);
        this->concurrentWorkDoneEvent = NULL;
        CloseHandle(this->concurrentWorkReadyEvent);
        this->concurrentWorkReadyEvent = NULL;
        return false;
    }

    return true;
}